

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

xmlChar * xmlSchemaFormatIDCKeySequence_1
                    (xmlSchemaValidCtxtPtr vctxt,xmlChar **buf,xmlSchemaPSVIIDCKeyPtr *seq,int count
                    ,int for_hash)

{
  xmlSchemaValPtr val;
  int iVar1;
  xmlSchemaWhitespaceValueType ws;
  xmlChar *pxVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  xmlChar *value;
  int local_44;
  xmlSchemaValidCtxtPtr local_40;
  xmlSchemaPSVIIDCKeyPtr *local_38;
  
  value = (xmlChar *)0x0;
  local_44 = for_hash;
  local_40 = vctxt;
  local_38 = seq;
  pxVar2 = xmlStrdup("[");
  *buf = pxVar2;
  uVar5 = 0;
  uVar4 = (ulong)(uint)count;
  if (count < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    pxVar2 = xmlStrcat(*buf,"\'");
    *buf = pxVar2;
    val = local_38[uVar5]->val;
    if (local_44 == 0) {
      ws = xmlSchemaGetWhiteSpaceFacetValue(local_38[uVar5]->type);
      iVar1 = xmlSchemaGetCanonValueWhtspExt(val,ws,&value);
    }
    else {
      iVar1 = xmlSchemaGetCanonValueWhtspExt_1(val,XML_SCHEMA_WHITESPACE_COLLAPSE,&value,1);
    }
    if (iVar1 == 0) {
      pxVar2 = *buf;
      pcVar3 = (char *)value;
    }
    else {
      xmlSchemaInternalErr
                ((xmlSchemaAbstractCtxtPtr)local_40,"xmlSchemaFormatIDCKeySequence",
                 "failed to compute a canonical value");
      pxVar2 = *buf;
      pcVar3 = "???";
    }
    pxVar2 = xmlStrcat(pxVar2,(xmlChar *)pcVar3);
    *buf = pxVar2;
    pcVar3 = "\'";
    if ((long)uVar5 < (long)(count + -1)) {
      pcVar3 = "\', ";
    }
    pxVar2 = xmlStrcat(pxVar2,(xmlChar *)pcVar3);
    *buf = pxVar2;
    if (value != (xmlChar *)0x0) {
      (*xmlFree)(value);
      value = (xmlChar *)0x0;
    }
  }
  pxVar2 = xmlStrcat(*buf,(xmlChar *)"]");
  *buf = pxVar2;
  return pxVar2;
}

Assistant:

static const xmlChar *
xmlSchemaFormatIDCKeySequence_1(xmlSchemaValidCtxtPtr vctxt,
				xmlChar **buf,
				xmlSchemaPSVIIDCKeyPtr *seq,
				int count, int for_hash)
{
    int i, res;
    xmlChar *value = NULL;

    *buf = xmlStrdup(BAD_CAST "[");
    for (i = 0; i < count; i++) {
	*buf = xmlStrcat(*buf, BAD_CAST "'");
	if (!for_hash)
	    res = xmlSchemaGetCanonValueWhtspExt(seq[i]->val,
		    xmlSchemaGetWhiteSpaceFacetValue(seq[i]->type),
		    &value);
	else {
	    res = xmlSchemaGetCanonValueHash(seq[i]->val, &value);
	}
	if (res == 0)
	    *buf = xmlStrcat(*buf, BAD_CAST value);
	else {
	    VERROR_INT("xmlSchemaFormatIDCKeySequence",
		"failed to compute a canonical value");
	    *buf = xmlStrcat(*buf, BAD_CAST "???");
	}
	if (i < count -1)
	    *buf = xmlStrcat(*buf, BAD_CAST "', ");
	else
	    *buf = xmlStrcat(*buf, BAD_CAST "'");
	if (value != NULL) {
	    xmlFree(value);
	    value = NULL;
	}
    }
    *buf = xmlStrcat(*buf, BAD_CAST "]");

    return (BAD_CAST *buf);
}